

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_pkt.cc
# Opt level: O2

ssl_open_record_t
bssl::tls_open_change_cipher_spec
          (SSL *ssl,size_t *out_consumed,uint8_t *out_alert,Span<unsigned_char> in)

{
  ssl_open_record_t sVar1;
  size_t in_R9;
  Span<const_unsigned_char> in_00;
  uint8_t type;
  Span<unsigned_char> body;
  
  body.data_ = (uchar *)0x0;
  body.size_ = 0;
  sVar1 = tls_open_record(ssl,&type,&body,out_consumed,out_alert,in);
  if (sVar1 == ssl_open_record_success) {
    if (type == '\x14') {
      if ((body.size_ == 1) && (*body.data_ == '\x01')) {
        in_00.size_ = in_R9;
        in_00.data_ = (uchar *)0x1;
        ssl_do_msg_callback((bssl *)ssl,(SSL *)0x0,0x14,(int)body.data_,in_00);
        return ssl_open_record_success;
      }
      ERR_put_error(0x10,0,0x67,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                    ,0x135);
      *out_alert = '/';
    }
    else {
      ERR_put_error(0x10,0,0xe1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                    ,0x12f);
      *out_alert = '\n';
    }
    sVar1 = ssl_open_record_error;
  }
  return sVar1;
}

Assistant:

ssl_open_record_t tls_open_change_cipher_spec(SSL *ssl, size_t *out_consumed,
                                              uint8_t *out_alert,
                                              Span<uint8_t> in) {
  uint8_t type;
  Span<uint8_t> body;
  auto ret = tls_open_record(ssl, &type, &body, out_consumed, out_alert, in);
  if (ret != ssl_open_record_success) {
    return ret;
  }

  if (type != SSL3_RT_CHANGE_CIPHER_SPEC) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_RECORD);
    *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
    return ssl_open_record_error;
  }

  if (body.size() != 1 || body[0] != SSL3_MT_CCS) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_CHANGE_CIPHER_SPEC);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return ssl_open_record_error;
  }

  ssl_do_msg_callback(ssl, 0 /* read */, SSL3_RT_CHANGE_CIPHER_SPEC, body);
  return ssl_open_record_success;
}